

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdistancefield.cpp
# Opt level: O1

void __thiscall
QDistanceField::setGlyph
          (QDistanceField *this,QFontEngine *fontEngine,glyph_t glyph,bool doubleResolution)

{
  glyph_t gVar1;
  QDistanceFieldData *pQVar2;
  long in_FS_OFFSET;
  QPainterPath path;
  QFixedPoint position;
  QRectF local_70;
  QPainterPath local_50;
  undefined8 local_44;
  glyph_t local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_44 = 0;
  local_50.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  local_3c = glyph;
  QPainterPath::QPainterPath(&local_50);
  (*fontEngine->_vptr_QFontEngine[0xf])(fontEngine,&local_3c,&local_44,1,&local_50,0);
  QPainterPath::boundingRect(&local_70,&local_50);
  QPainterPath::translate(&local_50,-local_70.xp,-local_70.yp);
  QPainterPath::setFillRule(&local_50,WindingFill);
  pQVar2 = QDistanceFieldData::create(&local_50,doubleResolution);
  QSharedDataPointer<QDistanceFieldData>::reset(&this->d,pQVar2);
  gVar1 = local_3c;
  pQVar2 = (this->d).d.ptr;
  if ((pQVar2 != (QDistanceFieldData *)0x0) &&
     ((__atomic_base<int>)
      *(__int_type *)
       &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value != (__atomic_base<int>)0x1)) {
    QSharedDataPointer<QDistanceFieldData>::detach_helper(&this->d);
  }
  ((this->d).d.ptr)->glyph = gVar1;
  QPainterPath::~QPainterPath(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDistanceField::setGlyph(QFontEngine *fontEngine, glyph_t glyph, bool doubleResolution)
{
    QFixedPoint position;
    QPainterPath path;
    fontEngine->addGlyphsToPath(&glyph, &position, 1, &path, { });
    path.translate(-path.boundingRect().topLeft());
    path.setFillRule(Qt::WindingFill);

    d = QDistanceFieldData::create(path, doubleResolution);
    d->glyph = glyph;
}